

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double beta_cdf_inv_old(double cdf,double a,double b)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  int iVar11;
  double *pdVar12;
  int iVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double x;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  code *pcVar21;
  double dVar22;
  double local_ce0 [17];
  double dStack_c58;
  code *apcStack_c50 [2];
  double d [380];
  
  if ((cdf < 0.0) || (1.0 < cdf)) {
    apcStack_c50[0] = (code *)0x193b58;
    std::operator<<((ostream *)&std::cerr," \n");
    apcStack_c50[0] = (code *)0x193b67;
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV_OLD - Fatal error!\n");
    apcStack_c50[0] = (code *)0x193b76;
    std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
    apcStack_c50[0] = beta_pdf;
    exit(1);
  }
  dVar16 = a / (a + b);
  if (0.01 <= ABS(dVar16 / dVar16)) {
    iVar13 = 2;
    x = dVar16;
    do {
      dVar16 = 0.0;
      if ((0.0 < x) && (dVar16 = 1.0, x <= 1.0)) {
        apcStack_c50[0] = (code *)0x193830;
        dVar16 = beta_inc(a,b,x);
      }
      apcStack_c50[0] = (code *)0x19384d;
      d[0x17b] = dVar16;
      dVar15 = beta_pdf(x,a,b);
      dVar15 = (cdf - d[0x17b]) / dVar15;
      dVar17 = ((b + -1.0) * dVar15) / (1.0 - x);
      dVar18 = ((1.0 - a) * dVar15) / x;
      d[0] = dVar17 + dVar18;
      dVar19 = (dVar17 + dVar18) * dVar15 * 0.5;
      dVar16 = x + dVar15 + dVar19;
      if (0.0001 < ABS(dVar19 / dVar16)) {
        iVar3 = 0;
        pdVar4 = local_ce0;
        uVar5 = 3;
        do {
          dVar19 = (double)(int)uVar5;
          dVar17 = (dVar17 * (double)(int)(uVar5 - 2) * dVar15) / (1.0 - x);
          dVar18 = (dVar18 * (2.0 - dVar19) * dVar15) / dVar16;
          d[(uVar5 - 2) * 0x14] = dVar17 + dVar18;
          if (3 < uVar5) {
            uVar6 = 3;
            pdVar7 = pdVar4;
            iVar8 = iVar3;
            do {
              lVar9 = uVar5 - uVar6;
              lVar2 = lVar9 * 0x14;
              dVar20 = d[0] * (&dStack_c58)[uVar6 + lVar2];
              if (0 < lVar9) {
                lVar14 = 0;
                dVar22 = 1.0;
                pdVar10 = pdVar7;
                iVar11 = iVar8;
                pdVar12 = d;
                do {
                  pdVar12 = pdVar12 + 0x14;
                  lVar14 = lVar14 + 1;
                  dVar22 = ((double)iVar11 * dVar22) / (double)(int)lVar14;
                  dVar20 = dVar20 + *pdVar12 * dVar22 * *pdVar10;
                  iVar11 = iVar11 + -1;
                  pdVar10 = pdVar10 + -0x14;
                } while (lVar14 < lVar9);
              }
              d[lVar2 + uVar6 + -2] = d[uVar6 + lVar2 + 0x11] / (double)((int)uVar6 + -1) + dVar20;
              uVar6 = uVar6 + 1;
              iVar8 = iVar8 + -1;
              pdVar7 = pdVar7 + -0x13;
            } while (uVar6 != uVar5);
          }
          pcVar21 = (code *)(d[0] * (&dStack_c58)[uVar5] +
                            d[uVar5 + 0x11] / (double)((int)uVar5 + -1));
          apcStack_c50[uVar5] = pcVar21;
          dVar19 = ((double)pcVar21 * dVar15) / dVar19;
          dVar16 = dVar16 + dVar19;
          if ((dVar16 <= 0.0) || (1.0 <= dVar16)) {
            apcStack_c50[0] = (code *)0x193b00;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
            apcStack_c50[0] = (code *)0x193b14;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"BETA_CDF_INV_OLD - Fatal error!\n",0x20);
            apcStack_c50[0] = (code *)0x193b28;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"  The series has diverged.\n",0x1b);
            return -1.0;
          }
          if (ABS(dVar19 / dVar16) <= 0.0001) break;
          iVar3 = iVar3 + 1;
          pdVar4 = pdVar4 + 0x14;
          bVar1 = uVar5 < 0x14;
          uVar5 = uVar5 + 1;
        } while (bVar1);
      }
    } while ((0.01 <= ABS((dVar16 - x) / dVar16)) && (iVar13 = iVar13 + -1, x = dVar16, iVar13 != 0)
            );
  }
  return dVar16;
}

Assistant:

double beta_cdf_inv_old ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF_INV_OLD inverts the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    22 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Abernathy and Smith.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Abernathy, Smith,
//    Algorithm 724,
//    ACM Transactions on Mathematical Software,
//    Volume 19, Number 4, December 1993, pages 481-483.
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double BETA_CDF_INV, the argument of the CDF.
//
{
# define MAXK 20

  double bcoeff;
  double cdf_x;
  double d[MAXK * (MAXK-1)];
  double error = 0.0001;
  double errapp = 0.01;
  int i;
  int j;
  int k;
  int loopct;
  double pdf_x;
  double q;
  double s1;
  double s2;
  double sum2;
  double t;
  double tail;
  double x;
  double xold;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "BETA_CDF_INV_OLD - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }
//
//  Estimate the solution.
//
  x = a / ( a + b );

  xold = 0.0;
  loopct = 2;

  while ( errapp <= fabs ( ( x - xold ) / x ) && loopct != 0 )
  {
    xold = x;
    loopct = loopct - 1;
//
//  CDF_X = PROB { BETA(A,B) <= X }.
//  Q = ( CDF - CDF_X ) / PDF_X.
//
    cdf_x = beta_cdf ( x, a, b );

    pdf_x = beta_pdf ( x, a, b );

    q = ( cdf - cdf_x ) / pdf_x;
//
//  D(N,K) = C(N,K) * Q**(N+K-1) / (N-1)!
//
    t = 1.0 - x;
    s1 = q * ( b - 1.0 ) / t;
    s2 = q * ( 1.0 - a ) / x;
    d[2-1+0*MAXK] = s1 + s2;
    tail = d[2-1+0*MAXK] * q / 2.0;
    x = x + q + tail;

    k = 3;

    while ( error < fabs ( tail / x ) && k <= MAXK )
    {
//
//  Find D(2,K-2).
//
      s1 = q * ( static_cast<double>(k ) - 2.0 ) * s1 / t;
      s2 = q * ( 2.0 - static_cast<double>(k ) ) * s2 / x;
      d[2-1+(k-2)*MAXK] = s1 + s2;
//
//  Find D(3,K-3), D(4,K-4), D(5,K-5), ... , D(K-1,1).
//
      for ( i = 3; i <= k-1; i++ )
      {
        sum2 = d[2-1+0*MAXK] * d[i-2+(k-i)*MAXK];
        bcoeff = 1.0;

        for ( j = 1; j <= k - i; j++ )
        {
          bcoeff = ( bcoeff * static_cast<double>(k - i - j + 1 ) )
            / static_cast<double>(j );
          sum2 = sum2 + bcoeff * d[2-1+j*MAXK] * d[i-2+(k-i-j)*MAXK];
        }
        d[i-1+(k-i)*MAXK] = sum2 + d[i-2+(k-i+1)*MAXK] / static_cast<double>(i - 1 );
      }
//
//  Compute D(K,0) and use it to expand the series.
//
      d[k-1+0*MAXK] = d[2-1+0*MAXK] * d[k-2+0*MAXK] + d[k-2+1*MAXK]
        / static_cast<double>(k - 1 );
      tail = d[k-1+0*MAXK] * q / static_cast<double>(k );
      x = x + tail;
//
//  Check for divergence.
//
      if ( x <= 0.0 || 1.0 <= x )
      {
        cerr << " \n";
        cerr << "BETA_CDF_INV_OLD - Fatal error!\n";
        cerr << "  The series has diverged.\n";
        x = -1.0;
        return x;
      }
      k = k + 1;
    }
  }
  return x;
# undef MAXK
}